

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CMethodList *stm)

{
  ulong uVar1;
  size_type sVar2;
  reference this_00;
  CError local_80;
  TypeInfo local_50;
  pointer local_28;
  pointer method;
  int index;
  bool areAllMethods;
  CMethodList *stm_local;
  CTypeCheckerVisitor *this_local;
  
  _index = stm;
  stm_local = (CMethodList *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: methodlist\n");
  method._7_1_ = 1;
  method._0_4_ = 0;
  do {
    uVar1 = (ulong)(int)method;
    sVar2 = std::
            vector<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
            ::size(&_index->methods);
    if (sVar2 <= uVar1) {
LAB_00143d28:
      if ((method._7_1_ & 1) == 0) {
        CError::CError(&local_80,(string *)CError::AST_ERROR_abi_cxx11_,
                       &(_index->super_IWrapper).super_PositionedNode.position);
        std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_80);
        CError::~CError(&local_80);
      }
      else {
        TypeInfo::TypeInfo(&local_50,VOID);
        TypeInfo::operator=(&this->lastCalculatedType,&local_50);
        TypeInfo::~TypeInfo(&local_50);
      }
      return;
    }
    this_00 = std::
              vector<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
              ::operator[](&_index->methods,(long)(int)method);
    local_28 = std::unique_ptr<CMethod,_std::default_delete<CMethod>_>::get(this_00);
    if (local_28 == (pointer)0x0) {
      method._7_1_ = 0;
      goto LAB_00143d28;
    }
    (**(local_28->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(local_28,this);
    method._0_4_ = (int)method + 1;
  } while( true );
}

Assistant:

void CTypeCheckerVisitor::Visit( CMethodList &stm ) 
{
	std::cout << "typechecker: methodlist\n";
    bool areAllMethods = true;
    for (int index = 0; index < stm.methods.size(); ++index) {
        auto method = stm.methods[index].get();
        if( !method ) {
            areAllMethods = false;
            break;
        }
        method->Accept( *this );
    }
    if( areAllMethods ) {
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}